

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
ser::MetainfoSet::types(vector<int,_std::allocator<int>_> *__return_storage_ptr__,MetainfoSet *this)

{
  _Rb_tree_node_base *this_00;
  long *plVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  any *operand;
  type_info *ptVar5;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (__return_storage_ptr__,(this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var3 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
      return __return_storage_ptr__;
    }
    plVar1 = *(long **)(p_Var3 + 2);
    ptVar5 = (type_info *)&void::typeinfo;
    if (plVar1 != (long *)0x0) {
      ptVar5 = (type_info *)(**(code **)(*plVar1 + 0x10))(plVar1);
    }
    bVar2 = std::type_info::operator==(ptVar5,(type_info *)&bool::typeinfo);
    if (bVar2) {
      local_50._M_dataplus._M_p._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (__return_storage_ptr__,(int *)&local_50);
    }
    else {
      this_00 = p_Var3 + 2;
      plVar1 = *(long **)this_00;
      ptVar5 = (type_info *)&void::typeinfo;
      if (plVar1 != (long *)0x0) {
        ptVar5 = (type_info *)(**(code **)(*plVar1 + 0x10))(plVar1);
      }
      bVar2 = std::type_info::operator==(ptVar5,(type_info *)&int::typeinfo);
      if (bVar2) {
        local_50._M_dataplus._M_p._0_4_ = 0xfffffffe;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (__return_storage_ptr__,(int *)&local_50);
      }
      else {
        plVar1 = *(long **)this_00;
        ptVar5 = (type_info *)&void::typeinfo;
        if (plVar1 != (long *)0x0) {
          ptVar5 = (type_info *)(**(code **)(*plVar1 + 0x10))(plVar1);
        }
        bVar2 = std::type_info::operator==(ptVar5,(type_info *)&float::typeinfo);
        if (bVar2) {
          local_50._M_dataplus._M_p._0_4_ = 0xfffffffd;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (__return_storage_ptr__,(int *)&local_50);
        }
        else {
          plVar1 = *(long **)this_00;
          ptVar5 = (type_info *)&void::typeinfo;
          if (plVar1 != (long *)0x0) {
            ptVar5 = (type_info *)(**(code **)(*plVar1 + 0x10))(plVar1);
          }
          bVar2 = std::type_info::operator==(ptVar5,(type_info *)&double::typeinfo);
          if (bVar2) {
            local_50._M_dataplus._M_p._0_4_ = 0xfffffffc;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (__return_storage_ptr__,(int *)&local_50);
          }
          else {
            plVar1 = *(long **)this_00;
            ptVar5 = (type_info *)&void::typeinfo;
            if (plVar1 != (long *)0x0) {
              ptVar5 = (type_info *)(**(code **)(*plVar1 + 0x10))(plVar1);
            }
            bVar2 = std::type_info::operator==(ptVar5,(type_info *)&std::__cxx11::string::typeinfo);
            if (!bVar2) {
              poVar4 = std::operator<<((ostream *)&std::cout,"Error: type of metainfo ");
              poVar4 = std::operator<<(poVar4,(string *)(p_Var3 + 1));
              std::operator<<(poVar4," is not supported\n");
              exit(1);
            }
            boost::any_cast<std::__cxx11::string>(&local_50,(boost *)this_00,operand);
            local_54 = (int)local_50._M_string_length;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (__return_storage_ptr__,&local_54);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

std::vector<int> MetainfoSet::types() const
{
    std::vector<int> ret;
    ret.reserve(data_.size());
    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        if (iter->second.type() == typeid(bool))
            ret.push_back(-1);
        else if (iter->second.type() == typeid(int))
            ret.push_back(-2);
        else if (iter->second.type() == typeid(float))
            ret.push_back(-3);
        else if (iter->second.type() == typeid(double))
            ret.push_back(-4);
        else if (iter->second.type() == typeid(std::string))
            ret.push_back(boost::any_cast<std::string>(iter->second).size());
        else
        {
            std::cout << "Error: type of metainfo " << iter->first << " is not supported\n";
            std::exit(1);
        }
    }
    return ret;
}